

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

void __thiscall
gmath::RadialTangentialDistortion::RadialTangentialDistortion
          (RadialTangentialDistortion *this,Properties *prop,int id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int in_ECX;
  int iVar2;
  undefined4 in_register_00000014;
  string local_40;
  
  (this->super_Distortion)._vptr_Distortion = (_func_int **)&PTR__Distortion_00178a08;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"p1",(char *)CONCAT44(in_register_00000014,id),
             in_ECX);
  iVar2 = 0x163970;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd,"0");
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"p2",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x163970;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 1,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k1",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x163970;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 2,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k2",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x163970;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 3,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k3",(char *)(ulong)(uint)id,iVar2);
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 4,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  this->kn = 0;
  if ((this->kd[4] != 0.0) || (NAN(this->kd[4]))) {
    this->kn = 1;
  }
  if (0 < this->kn || this->kd[3] != 0.0) {
    this->kn = this->kn + 1;
  }
  if (0 < this->kn || this->kd[2] != 0.0) {
    this->kn = this->kn + 1;
  }
  return;
}

Assistant:

RadialTangentialDistortion::RadialTangentialDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("p1", id).c_str(), kd[0], "0");
  prop.getValue(getCameraKey("p2", id).c_str(), kd[1], "0");

  prop.getValue(getCameraKey("k1", id).c_str(), kd[2], "0");
  prop.getValue(getCameraKey("k2", id).c_str(), kd[3], "0");
  prop.getValue(getCameraKey("k3", id).c_str(), kd[4], "0");

  kn=0;

  if (kd[4] != 0)
  {
    kn++;
  }

  if (kd[3] != 0 || kn > 0)
  {
    kn++;
  }

  if (kd[2] != 0 || kn > 0)
  {
    kn++;
  }
}